

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<float>::AutoFill(TPZMatrix<float> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float val;
  float local_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_50;
  float local_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_50 = symmetric;
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar4 = 0;
    do {
      local_68 = 0.0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      lVar3 = 0;
      if (lVar4 != 0 && local_50 != 0) {
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar4);
          local_6c = extraout_XMM0_Da;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar4,lVar3,&local_6c);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar3);
          local_68 = local_68 + ABS(extraout_XMM0_Da_00);
          lVar3 = lVar3 + 1;
        } while (lVar4 != lVar3);
      }
      for (; lVar1 = (this->super_TPZBaseMatrix).fCol, lVar3 < lVar1; lVar3 = lVar3 + 1) {
        local_4c = GetRandomVal(this);
        if (lVar4 != lVar3) {
          local_68 = local_68 + ABS(local_4c);
        }
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar4,lVar3,&local_4c);
        if (iVar2 == 0) {
          Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
        }
      }
      if ((this->super_TPZBaseMatrix).fRow == lVar1) {
        local_48 = ABS(local_68);
        uStack_44 = uStack_64 & 0x7fffffff;
        uStack_40 = uStack_60 & 0x7fffffff;
        uStack_3c = uStack_5c & 0x7fffffff;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4);
        if (ABS(extraout_XMM0_Da_01) < local_48) {
          local_6c = local_68 + 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar4,lVar4,&local_6c);
        }
        if ((local_48 < 1e-06) &&
           ((*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4)
           , ABS(extraout_XMM0_Da_02) < 1e-06)) {
          local_6c = 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar4,lVar4,&local_6c);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}